

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

void __thiscall
PcodeOpBank::moveSequenceDead(PcodeOpBank *this,PcodeOp *firstop,PcodeOp *lastop,PcodeOp *prev)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  size_t in_R9;
  uint in_stack_00000008;
  
  p_Var1 = ((prev->insertiter)._M_node)->_M_next;
  p_Var2 = (firstop->insertiter)._M_node;
  if (p_Var1 != p_Var2) {
    std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::splice
              (&this->deadlist,(int)p_Var1,(__off64_t *)&this->deadlist,(int)p_Var2,
               (__off64_t *)((lastop->insertiter)._M_node)->_M_next,in_R9,in_stack_00000008);
    return;
  }
  return;
}

Assistant:

void PcodeOpBank::moveSequenceDead(PcodeOp *firstop,PcodeOp *lastop,PcodeOp *prev)

{
  list<PcodeOp *>::iterator enditer = lastop->insertiter;
  ++enditer;
  list<PcodeOp *>::iterator previter = prev->insertiter;
  ++previter;
  if (previter != firstop->insertiter) // Check for degenerate move
    deadlist.splice(previter,deadlist,firstop->insertiter,enditer);
}